

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O1

shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
 __thiscall
pstore::index::
get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
          (index *this,database *db,bool create)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *phVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  shared_ptr<const_pstore::trailer> sVar6;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  sVar7;
  typed_address<pstore::index::header_block> location;
  shared_ptr<const_pstore::trailer> footer;
  undefined1 local_49;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  typed_address<pstore::index::header_block> local_38;
  _func_int **local_30;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_28;
  
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(in_register_00000011,create);
  if ((db->indices_)._M_elems[0].
      super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) goto LAB_00113ca7;
  sVar6 = database::getro<pstore::trailer,void>
                    ((database *)&stack0xffffffffffffffd0,(typed_address<pstore::trailer>)db,
                     (db->size_).footer_pos_.a_.a_);
  _Var5 = sVar6.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  local_38.a_.a_ = (address)local_30[5];
  if (local_38.a_.a_ == 0) {
    if (create) {
      local_48 = (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::allocator<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::database_const&>
                (&_Stack_40,&local_48,
                 (allocator<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                  *)&local_49,db);
      _Var5._M_pi = extraout_RDX_00;
      goto LAB_00113c63;
    }
  }
  else {
    local_48 = (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::allocator<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>,pstore::database_const&,pstore::typed_address<pstore::index::header_block>const&>
              (&_Stack_40,&local_48,
               (allocator<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)&local_49,db,&local_38);
    _Var5._M_pi = extraout_RDX;
LAB_00113c63:
    _Var4._M_pi = _Stack_40._M_pi;
    phVar3 = local_48;
    local_48 = (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (db->indices_)._M_elems[0].
             super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (db->indices_)._M_elems[0].
    super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &phVar3->super_index_base;
    (db->indices_)._M_elems[0].
    super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      _Var5._M_pi = extraout_RDX_01;
    }
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      _Var5._M_pi = extraout_RDX_02;
    }
  }
  if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_28._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_head_impl);
    _Var5._M_pi = extraout_RDX_03;
  }
LAB_00113ca7:
  if (((create) ||
      ((db->indices_)._M_elems[0].
       super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) &&
     ((peVar2 = (db->indices_)._M_elems[0].
                super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar2 == (element_type *)0x0 ||
      (peVar2->_vptr_index_base != (_func_int **)&PTR__hamt_map_0015ba40)))) {
    assert_failed("(!create && dx.get () == nullptr) || dynamic_cast<Return *> (dx.get ()) != nullptr"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/index_types.hpp"
                  ,0x93);
  }
  *(element_type **)this =
       (db->indices_)._M_elems[0].
       super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (db->indices_)._M_elems[0].
           super___shared_ptr<pstore::index::index_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar7.
  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var5._M_pi;
  sVar7.
  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          )sVar7.
           super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Return> get_index (Database & db, bool const create = true) {
            auto & dx = db.get_mutable_index (Index);

            // Have we already loaded this index?
            if (dx.get () == nullptr) {
                std::shared_ptr<trailer const> const footer = db.get_footer ();
                typed_address<index::header_block> const location = footer->a.index_records.at (
                    static_cast<typename std::underlying_type<decltype (Index)>::type> (Index));
                if (location == decltype (location)::null ()) {
                    if (create) {
                        // Create a new (empty) index.
                        dx = std::make_shared<typename std::remove_const<Return>::type> (db);
                    }
                } else {
                    // Construct the index from the location.
                    dx = std::make_shared<typename std::remove_const<Return>::type> (db, location);
                }
            }

#ifdef PSTORE_CPP_RTTI
            PSTORE_ASSERT ((!create && dx.get () == nullptr) ||
                           dynamic_cast<Return *> (dx.get ()) != nullptr);
#endif
            return std::static_pointer_cast<Return> (dx);
        }